

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::elasticityFilterReturn
          (Highs *this,HighsStatus return_status,bool feasible_model,HighsInt original_num_col,
          HighsInt original_num_row,vector<double,_std::allocator<double>_> *original_col_cost,
          vector<double,_std::allocator<double>_> *original_col_lower,
          vector<double,_std::allocator<double>_> *original_col_upper,
          vector<HighsVarType,_std::allocator<HighsVarType>_> *original_integrality)

{
  undefined8 uVar1;
  size_type sVar2;
  byte in_DL;
  HighsStatus in_ESI;
  long in_RDI;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_00000018;
  HighsInt in_stack_00000020;
  HighsInt in_stack_00000024;
  Highs *in_stack_00000028;
  HighsStatus run_status;
  double objective_function_value;
  HighsLp *lp;
  HighsInt in_stack_0000006c;
  HighsModel *in_stack_00000088;
  HighsOptions *in_stack_00000090;
  double *in_stack_000000b8;
  HighsInt in_stack_000000c0;
  HighsInt in_stack_000000c4;
  Highs *in_stack_000000c8;
  HighsInt in_stack_000000d0;
  HighsInt in_stack_000000d4;
  Highs *in_stack_000000d8;
  
  uVar1 = *(undefined8 *)(in_RDI + 0xee0);
  deleteRows(in_stack_00000028,in_stack_00000024,in_stack_00000020);
  deleteCols(in_stack_00000028,in_stack_00000024,in_stack_00000020);
  *(undefined1 *)(in_RDI + 0x70) = 0;
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x4e2d39);
  changeColsCost(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000b8);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x4e2d65);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x4e2d74);
  changeColsBounds(in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,(double *)in_stack_000000c8
                   ,(double *)CONCAT44(in_stack_000000c4,in_stack_000000c0));
  sVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size(in_stack_00000018);
  if (sVar2 != 0) {
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::data
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x4e2db4);
    changeColsIntegrality
              (in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,
               (HighsVarType *)in_stack_000000b8);
  }
  if (in_ESI == kOk) {
    HighsSparseMatrix::productQuad
              ((HighsSparseMatrix *)original_integrality,original_col_upper,original_col_lower,
               in_stack_0000006c);
    *(undefined1 *)(in_RDI + 8) = 1;
    *(undefined8 *)(in_RDI + 0xee0) = uVar1;
    getKktFailures(in_stack_00000090,in_stack_00000088,(HighsSolution *)original_integrality,
                   (HighsBasis *)original_col_upper,(HighsInfo *)original_col_lower);
    *(undefined1 *)(in_RDI + 0xeb0) = 1;
  }
  if ((in_DL & 1) != 0) {
    *(undefined4 *)(in_RDI + 0x1244) = 0;
  }
  return in_ESI;
}

Assistant:

HighsStatus Highs::elasticityFilterReturn(
    const HighsStatus return_status, const bool feasible_model,
    const HighsInt original_num_col, const HighsInt original_num_row,
    const std::vector<double>& original_col_cost,
    const std::vector<double>& original_col_lower,
    const std::vector<double> original_col_upper,
    const std::vector<HighsVarType> original_integrality) {
  const HighsLp& lp = this->model_.lp_;
  double objective_function_value = info_.objective_function_value;
  // Delete any additional rows and columns, and restore the original
  // column costs and bounds
  HighsStatus run_status;
  run_status = this->deleteRows(original_num_row, lp.num_row_ - 1);
  assert(run_status == HighsStatus::kOk);

  run_status = this->deleteCols(original_num_col, lp.num_col_ - 1);
  assert(run_status == HighsStatus::kOk);
  //
  // Now that deleteRows and deleteCols may yield a valid basis, the
  // lack of dual values triggers an assert in
  // getKktFailures. Ultimately (#2081) the dual values will be
  // available but, for now, make the basis invalid.
  basis_.valid = false;

  run_status =
      this->changeColsCost(0, original_num_col - 1, original_col_cost.data());
  assert(run_status == HighsStatus::kOk);

  run_status =
      this->changeColsBounds(0, original_num_col - 1, original_col_lower.data(),
                             original_col_upper.data());
  assert(run_status == HighsStatus::kOk);

  if (original_integrality.size()) {
    this->changeColsIntegrality(0, original_num_col - 1,
                                original_integrality.data());
    assert(run_status == HighsStatus::kOk);
  }

  assert(lp.num_col_ == original_num_col);
  assert(lp.num_row_ == original_num_row);

  if (return_status == HighsStatus::kOk) {
    // Solution is invalidated by deleting rows and columns, but
    // primal values are correct. Have to recompute row activities,
    // though
    this->model_.lp_.a_matrix_.productQuad(this->solution_.row_value,
                                           this->solution_.col_value);
    this->solution_.value_valid = true;
    // Set the feasibility objective and any KKT failures
    info_.objective_function_value = objective_function_value;
    getKktFailures(options_, model_, solution_, basis_, info_);
    info_.valid = true;
  }

  // If the model is feasible, then the status of model is not known
  if (feasible_model) this->model_status_ = HighsModelStatus::kNotset;

  return return_status;
}